

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

int __thiscall Gnuplot::init(Gnuplot *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  char *__command;
  FILE *pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string tmp;
  Gnuplot *this_local;
  
  tmp.field_2._8_8_ = this;
  std::operator+(&local_50,&m_sGNUPlotPath_abi_cxx11_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&m_sGNUPlotFileName_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  __command = (char *)std::__cxx11::string::c_str();
  pFVar2 = popen(__command,"w");
  this->gnucmd = (FILE *)pFVar2;
  this->nplots = 0;
  this->valid = true;
  std::__cxx11::string::operator=((string *)&this->smooth,"");
  showonscreen(this);
  iVar1 = std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

void Gnuplot::init() {
  // char * getenv ( const char * name );  get value of environment variable
  // Retrieves a C string containing the value of the environment variable
  // whose name is specified as argument.  If the requested variable is not
  // part of the environment list, the function returns a NULL pointer.
#if ( defined(unix) || defined(__unix) || defined(__unix__) ) && !defined(__APPLE__)
//    if (getenv("DISPLAY") == NULL)
//    {
//        valid = false;
//        throw GnuplotException("Can't find DISPLAY variable");
//    }
#endif

  // if gnuplot not available
//  if (!Gnuplot::get_program_path()) {
//    valid = false;
//     throw GnuplotException("Can't find gnuplot");
//  }

  //
  // open pipe
  //
  std::string tmp = Gnuplot::m_sGNUPlotPath + "/" +
                        Gnuplot::m_sGNUPlotFileName;

  // FILE *popen(const char *command, const char *mode);
  // The popen() function shall execute the command specified by the string
  // command, create a pipe between the calling program and the executed
  // command, and return a pointer to a stream that can be used to either read
  // from or write to the pipe.
#if defined(WIN32) || defined(_WIN32) || defined(__WIN32__) || defined(__TOS_WIN__)
  gnucmd = _popen(tmp.c_str(), "w");
#elif defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
  gnucmd = popen(tmp.c_str(), "w");
#endif

  // popen() shall return a pointer to an open stream that can be used to read
  // or write to the pipe.  Otherwise, it shall return a null pointer and may
  // set errno to indicate the error.
  if (!gnucmd) {
//    valid = false;
//    throw GnuplotException("Couldn't open connection to gnuplot");
  }

  nplots = 0;
  valid = true;
  smooth = "";

  // set terminal type
  showonscreen();

  return;
}